

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

Vec_Ptr_t * Llb_ManFlowCompute(Aig_Man_t *p)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  Aig_Obj_t *pAVar7;
  long lVar8;
  
  Aig_ManCleanData(p);
  Aig_ManIncrementTravId(p);
  pVVar5 = p->vObjs;
  if (pVVar5->nSize < 1) {
    iVar6 = 0;
  }
  else {
    lVar8 = 0;
    iVar6 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      if ((pvVar1 != (void *)0x0) && ((*(ulong *)((long)pvVar1 + 0x18) & 0x20) != 0)) {
        if ((*(ulong *)((long)pvVar1 + 0x18) & 0x10) != 0) {
          __assert_fail("!pObj->fMarkA",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                        ,0x34b,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
        }
        pAVar7 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe);
        if ((pAVar7->field_0x18 & 0x20) == 0) {
          iVar3 = Llb_ManFlowBwdPath2_rec(p,pAVar7);
          iVar6 = iVar6 + iVar3;
          if (iVar3 != 0) {
            Aig_ManIncrementTravId(p);
          }
        }
        if ((0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7) &&
           (pAVar7 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe),
           (pAVar7->field_0x18 & 0x20) == 0)) {
          iVar3 = Llb_ManFlowBwdPath2_rec(p,pAVar7);
          iVar6 = iVar6 + iVar3;
          if (iVar3 != 0) {
            Aig_ManIncrementTravId(p);
          }
        }
      }
      lVar8 = lVar8 + 1;
      pVVar5 = p->vObjs;
    } while (lVar8 < pVVar5->nSize);
  }
  Aig_ManIncrementTravId(p);
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      if (pvVar1 != (void *)0x0) {
        uVar2 = *(ulong *)((long)pvVar1 + 0x18);
        uVar4 = (uint)uVar2;
        if ((uVar2 & 0x20) != 0) {
          if ((uVar2 & 0x10) != 0) {
            __assert_fail("!pObj->fMarkA",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                          ,0x365,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
          }
          pAVar7 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe);
          if ((pAVar7->field_0x18 & 0x20) == 0) {
            iVar3 = Llb_ManFlowBwdPath2_rec(p,pAVar7);
            if (iVar3 != 0) {
              __assert_fail("RetValue == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                            ,0x369,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
            }
            uVar4 = (uint)*(undefined8 *)((long)pvVar1 + 0x18);
          }
          if (((0xfffffffd < (uVar4 & 7) - 7) &&
              (pAVar7 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe),
              (pAVar7->field_0x18 & 0x20) == 0)) &&
             (iVar3 = Llb_ManFlowBwdPath2_rec(p,pAVar7), iVar3 != 0)) {
            __assert_fail("RetValue == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                          ,0x36e,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
          }
        }
      }
      lVar8 = lVar8 + 1;
      pVVar5 = p->vObjs;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = Llb_ManFlowMinCut(p);
  if (pVVar5->nSize != iVar6) {
    __assert_fail("Vec_PtrSize(vMinCut) == Flow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                  ,0x373,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
  }
  Llb_ManFlowUpdateCut(p,pVVar5);
  iVar6 = Llb_ManFlowVerifyCut(p,pVVar5);
  if (iVar6 == 0) {
    puts("Llb_ManFlow() error! The computed min-cut is not a cut!");
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Llb_ManFlowCompute( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int Flow, FlowCur, RetValue, i;
    // find the max-flow
    Flow = 0;
    Aig_ManCleanData( p );
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMarkB )
            continue;
        assert( !pObj->fMarkA );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
//printf( "%d ", Aig_ObjFanin0(pObj)->Id );
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
//printf( "%d ", Aig_ObjFanin1(pObj)->Id );
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
    }
//printf( "\n" );

    // mark the nodes reachable from the latches
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMarkB )
            continue;
        assert( !pObj->fMarkA );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            assert( RetValue == 0 );
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            assert( RetValue == 0 );
        }
    }
    // find the min-cut with the smallest volume
    vMinCut = Llb_ManFlowMinCut( p );
    assert( Vec_PtrSize(vMinCut) == Flow );
//printf( "%d ", Vec_PtrSize(vMinCut) );
    Llb_ManFlowUpdateCut( p, vMinCut );
//printf( "%d   ", Vec_PtrSize(vMinCut) );
    // verify the cut
    if ( !Llb_ManFlowVerifyCut(p, vMinCut) )
        printf( "Llb_ManFlow() error! The computed min-cut is not a cut!\n" );
//    Llb_ManFlowPrintCut( p, vMinCut );
    return vMinCut;
}